

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

_Bool Curl_ipv6works(Curl_easy *data)

{
  _Bool _Var1;
  int __fd;
  
  if (data == (Curl_easy *)0x0) {
    __fd = socket(10,2,0);
    _Var1 = __fd != -1;
    if (_Var1) {
      close(__fd);
      _Var1 = true;
    }
  }
  else {
    if (data->multi->ipv6_up == '\0') {
      _Var1 = Curl_ipv6works((Curl_easy *)0x0);
      data->multi->ipv6_up = _Var1 + '\x01';
    }
    _Var1 = data->multi->ipv6_up == '\x02';
  }
  return _Var1;
}

Assistant:

bool Curl_ipv6works(struct Curl_easy *data)
{
  if(data) {
    /* the nature of most system is that IPv6 status does not come and go
       during a program's lifetime so we only probe the first time and then we
       have the info kept for fast reuse */
    DEBUGASSERT(data);
    DEBUGASSERT(data->multi);
    if(data->multi->ipv6_up == IPV6_UNKNOWN) {
      bool works = Curl_ipv6works(NULL);
      data->multi->ipv6_up = works ? IPV6_WORKS : IPV6_DEAD;
    }
    return data->multi->ipv6_up == IPV6_WORKS;
  }
  else {
    int ipv6_works = -1;
    /* probe to see if we have a working IPv6 stack */
    curl_socket_t s = socket(PF_INET6, SOCK_DGRAM, 0);
    if(s == CURL_SOCKET_BAD)
      /* an IPv6 address was requested but we cannot get/use one */
      ipv6_works = 0;
    else {
      ipv6_works = 1;
      sclose(s);
    }
    return (ipv6_works > 0) ? TRUE : FALSE;
  }
}